

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

int ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  uint uVar2;
  seqDef *psVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  int iVar7;
  ZSTD_longLengthType_e ZVar8;
  BYTE BVar9;
  ulong uVar10;
  ulong uVar11;
  
  psVar3 = seqStorePtr->sequencesStart;
  uVar10 = (ulong)((long)seqStorePtr->sequences - (long)psVar3) >> 3;
  if (seqStorePtr->maxNbSeq < (uVar10 & 0xffffffff)) {
    __assert_fail("nbSeq <= seqStorePtr->maxNbSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa55,"int ZSTD_seqToCodes(const seqStore_t *)");
  }
  pBVar4 = seqStorePtr->llCode;
  pBVar5 = seqStorePtr->mlCode;
  if ((int)uVar10 != 0) {
    pBVar6 = seqStorePtr->ofCode;
    uVar11 = 0;
    do {
      uVar2 = psVar3[uVar11].offBase;
      if (uVar2 == 0) {
        __assert_fail("val != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                      ,0xab,"unsigned int ZSTD_highbit32(U32)");
      }
      uVar1 = psVar3[uVar11].litLength;
      if (uVar1 < 0x40) {
        BVar9 = ZSTD_LLcode_LL_Code[(uint)uVar1];
      }
      else {
        iVar7 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        BVar9 = '2' - ((byte)iVar7 ^ 0x1f);
      }
      iVar7 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar1 = psVar3[uVar11].mlBase;
      pBVar4[uVar11] = BVar9;
      pBVar6[uVar11] = (BYTE)iVar7;
      if (uVar1 < 0x80) {
        BVar9 = ZSTD_MLcode_ML_Code[(uint)uVar1];
      }
      else {
        iVar7 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        BVar9 = 'C' - ((byte)iVar7 ^ 0x1f);
      }
      pBVar5[uVar11] = BVar9;
      uVar11 = uVar11 + 1;
    } while ((uVar10 & 0xffffffff) != uVar11);
  }
  ZVar8 = seqStorePtr->longLengthType;
  if (ZVar8 == ZSTD_llt_literalLength) {
    pBVar4[seqStorePtr->longLengthPos] = '#';
    ZVar8 = seqStorePtr->longLengthType;
  }
  if (ZVar8 == ZSTD_llt_matchLength) {
    pBVar5[seqStorePtr->longLengthPos] = '4';
  }
  return 0;
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}